

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O0

vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *
mercatortile::children
          (vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *__return_storage_ptr__,
          Tile *tile,int *zoom)

{
  initializer_list<mercatortile::Tile> __l;
  undefined8 *puVar1;
  reference pvVar2;
  allocator<mercatortile::Tile> local_169;
  iterator local_168;
  move_iterator<std::_Deque_iterator<mercatortile::Tile,_mercatortile::Tile_&,_mercatortile::Tile_*>_>
  local_148;
  iterator local_128;
  move_iterator<std::_Deque_iterator<mercatortile::Tile,_mercatortile::Tile_&,_mercatortile::Tile_*>_>
  local_108;
  undefined1 local_e1;
  value_type local_e0;
  value_type local_d4;
  value_type local_c8;
  value_type local_bc;
  undefined8 local_b0;
  Tile front_tile;
  allocator<mercatortile::Tile> local_91;
  Tile local_90;
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> return_tiles;
  int *zoom_local;
  Tile *tile_local;
  vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *return_vector_tiles;
  
  return_tiles.super__Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)zoom;
  if (tile->z <= *zoom) {
    local_90.z = tile->z;
    local_90.x = tile->x;
    local_90.y = tile->y;
    local_80 = &local_90;
    local_78 = 1;
    std::allocator<mercatortile::Tile>::allocator(&local_91);
    __l._M_len = local_78;
    __l._M_array = local_80;
    std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::deque
              ((deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)local_70,__l,
               &local_91);
    std::allocator<mercatortile::Tile>::~allocator(&local_91);
    while (pvVar2 = std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::front
                              ((deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)
                               local_70),
          pvVar2->z <
          *(int *)return_tiles.
                  super__Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>._M_impl
                  .super__Deque_impl_data._M_finish._M_node) {
      pvVar2 = std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::front
                         ((deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)local_70
                         );
      front_tile.x = pvVar2->z;
      local_b0._0_4_ = pvVar2->x;
      local_b0._4_4_ = pvVar2->y;
      std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::pop_front
                ((deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)local_70);
      local_bc.x = (int)local_b0 * 2;
      local_bc.y = local_b0._4_4_ * 2;
      local_bc.z = front_tile.x + 1;
      std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::push_back
                ((deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)local_70,
                 &local_bc);
      local_c8.x = (int)local_b0 * 2 + 1;
      local_c8.y = local_b0._4_4_ * 2;
      local_c8.z = front_tile.x + 1;
      std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::push_back
                ((deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)local_70,
                 &local_c8);
      local_d4.x = (int)local_b0 * 2;
      local_d4.y = local_b0._4_4_ * 2 + 1;
      local_d4.z = front_tile.x + 1;
      std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::push_back
                ((deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)local_70,
                 &local_d4);
      local_e0.x = (int)local_b0 * 2 + 1;
      local_e0.y = local_b0._4_4_ * 2 + 1;
      local_e0.z = front_tile.x + 1;
      std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::push_back
                ((deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)local_70,
                 &local_e0);
    }
    local_e1 = 0;
    std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::begin
              (&local_128,(deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)local_70
              );
    std::
    make_move_iterator<std::_Deque_iterator<mercatortile::Tile,mercatortile::Tile&,mercatortile::Tile*>>
              (&local_108,&local_128);
    std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::end
              (&local_168,(deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)local_70
              );
    std::
    make_move_iterator<std::_Deque_iterator<mercatortile::Tile,mercatortile::Tile&,mercatortile::Tile*>>
              (&local_148,&local_168);
    std::allocator<mercatortile::Tile>::allocator(&local_169);
    std::vector<mercatortile::Tile,std::allocator<mercatortile::Tile>>::
    vector<std::move_iterator<std::_Deque_iterator<mercatortile::Tile,mercatortile::Tile&,mercatortile::Tile*>>,void>
              ((vector<mercatortile::Tile,std::allocator<mercatortile::Tile>> *)
               __return_storage_ptr__,&local_108,&local_148,&local_169);
    std::allocator<mercatortile::Tile>::~allocator(&local_169);
    local_e1 = 1;
    std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::~deque
              ((deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)local_70);
    return __return_storage_ptr__;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "zoom should be greater than tile zoom level.";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

std::vector<Tile> children(const Tile &tile, const int &zoom)
{
    if (tile.z > zoom)
    {
        throw "zoom should be greater than tile zoom level.";
    };
    std::deque<Tile> return_tiles = {tile};
    while (return_tiles.front().z < zoom)
    {
        Tile front_tile = return_tiles.front();
        return_tiles.pop_front();
        return_tiles.push_back(Tile{front_tile.x * 2, front_tile.y * 2, front_tile.z + 1});
        return_tiles.push_back(Tile{front_tile.x * 2 + 1, front_tile.y * 2, front_tile.z + 1});
        return_tiles.push_back(Tile{front_tile.x * 2, front_tile.y * 2 + 1, front_tile.z + 1});
        return_tiles.push_back(Tile{front_tile.x * 2 + 1, front_tile.y * 2 + 1, front_tile.z + 1});
    }

    //TODO: hight memory, not efficiency, or consider anthoer method.
    vector<Tile> return_vector_tiles(std::make_move_iterator(return_tiles.begin()),
                                     std::make_move_iterator(return_tiles.end()));
    // copy(return_tiles.begin(), return_tiles.end(), back_inserter(return_vector_tiles));

    return return_vector_tiles;
}